

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void cleanup_class(void)

{
  player_class *ppVar1;
  start_item *psVar2;
  class_book *pcVar3;
  class_spell *pcVar4;
  start_item *p;
  player_class *p_00;
  long lVar5;
  long lVar6;
  long lVar7;
  
  p_00 = classes;
  if (classes != (player_class *)0x0) {
    do {
      ppVar1 = p_00->next;
      p = p_00->start_items;
      while (p != (start_item *)0x0) {
        psVar2 = p->next;
        mem_free(p->eopts);
        mem_free(p);
        p = psVar2;
      }
      if (L'\0' < (p_00->magic).num_books) {
        lVar7 = 0;
        do {
          pcVar3 = (p_00->magic).books;
          if (L'\0' < pcVar3[lVar7].num_spells) {
            lVar6 = 0x10;
            lVar5 = 0;
            do {
              pcVar4 = pcVar3[lVar7].spells;
              string_free(*(char **)((long)pcVar4 + lVar6 + -0x10));
              string_free(*(char **)((long)pcVar4 + lVar6 + -8));
              free_effect(*(effect **)((long)&pcVar4->name + lVar6));
              lVar5 = lVar5 + 1;
              lVar6 = lVar6 + 0x38;
            } while (lVar5 < pcVar3[lVar7].num_spells);
          }
          mem_free(pcVar3[lVar7].spells);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (p_00->magic).num_books);
      }
      mem_free((p_00->magic).books);
      lVar7 = 0xc;
      do {
        string_free(p_00->title[lVar7 + -3]);
        lVar7 = lVar7 + -1;
      } while (lVar7 != 2);
      string_free(p_00->name);
      mem_free(p_00);
      p_00 = ppVar1;
    } while (ppVar1 != (player_class *)0x0);
  }
  return;
}

Assistant:

static void cleanup_class(void)
{
	struct player_class *c = classes;
	struct player_class *next;
	struct start_item *item, *item_next;
	struct class_spell *spell;
	struct class_book *book;
	int i, j;

	while (c) {
		next = c->next;
		item = c->start_items;
		while(item) {
			item_next = item->next;
			mem_free(item->eopts);
			mem_free(item);
			item = item_next;
		}
		for (i = 0; i < c->magic.num_books; i++) {
			book = &c->magic.books[i];
			for (j = 0; j < book->num_spells; j++) {
				spell = &book->spells[j];
				string_free(spell->name);
				string_free(spell->text);
				free_effect(spell->effect);
			}
			mem_free(book->spells);
		}
		mem_free(c->magic.books);
		for (i = (int) N_ELEMENTS(c->title) - 1; i >= 0; --i) {
			string_free((char *)c->title[i]);
		}
		string_free((char *)c->name);
		mem_free(c);
		c = next;
	}
}